

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compressor.cpp
# Opt level: O1

uint64_t CompressAmount(uint64_t n)

{
  uint64_t uVar1;
  long lVar2;
  ulong uVar3;
  uint uVar4;
  long in_FS_OFFSET;
  bool bVar5;
  bool bVar6;
  
  if (n == 0) {
    uVar1 = 0;
  }
  else {
    uVar3 = n + (n / 5 & 0xfffffffffffffffe) * -5;
    bVar6 = uVar3 == 0;
    if (bVar6) {
      lVar2 = -9;
      do {
        uVar4 = (int)lVar2 + 9;
        n = n / 10;
        bVar5 = uVar4 < 8;
        lVar2 = lVar2 + 1;
        uVar3 = n % 10;
        bVar6 = uVar3 == 0;
        if (!bVar6) break;
      } while (uVar4 < 8);
    }
    else {
      bVar5 = true;
      lVar2 = -9;
    }
    if (bVar5) {
      if (bVar6) {
        __assert_fail("d >= 1 && d <= 9",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/compressor.cpp"
                      ,0xa0,"uint64_t CompressAmount(uint64_t)");
      }
      uVar1 = lVar2 + ((n / 10) * 9 + uVar3) * 10;
    }
    else {
      uVar1 = n * 10;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

uint64_t CompressAmount(uint64_t n)
{
    if (n == 0)
        return 0;
    int e = 0;
    while (((n % 10) == 0) && e < 9) {
        n /= 10;
        e++;
    }
    if (e < 9) {
        int d = (n % 10);
        assert(d >= 1 && d <= 9);
        n /= 10;
        return 1 + (n*9 + d - 1)*10 + e;
    } else {
        return 1 + (n - 1)*10 + 9;
    }
}